

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_DeletePropertyInt64(JSContext *ctx,JSValue obj,int64_t idx,int flags)

{
  int iVar1;
  JSAtom JVar2;
  ulong in_RCX;
  int64_t in_RDX;
  JSValue in_stack_00000000;
  int res;
  JSAtom prop;
  JSAtom in_stack_ffffffffffffffbc;
  JSContext *in_stack_ffffffffffffffc0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RCX < 0x80000000) {
    __JS_AtomFromUInt32((uint32_t)in_RCX);
    iVar1 = JS_DeleteProperty((JSContext *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                              in_stack_00000000,(JSAtom)((ulong)in_RDX >> 0x20),(int)in_RDX);
  }
  else {
    JVar2 = JS_NewAtomInt64((JSContext *)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDX);
    if (JVar2 == 0) {
      iVar1 = -1;
    }
    else {
      iVar1 = JS_DeleteProperty((JSContext *)
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                in_stack_00000000,(JSAtom)((ulong)in_RDX >> 0x20),(int)in_RDX);
      JS_FreeAtom(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    }
  }
  return iVar1;
}

Assistant:

int JS_DeletePropertyInt64(JSContext *ctx, JSValueConst obj, int64_t idx, int flags)
{
    JSAtom prop;
    int res;

    if ((uint64_t)idx <= JS_ATOM_MAX_INT) {
        /* fast path for fast arrays */
        return JS_DeleteProperty(ctx, obj, __JS_AtomFromUInt32(idx), flags);
    }
    prop = JS_NewAtomInt64(ctx, idx);
    if (prop == JS_ATOM_NULL)
        return -1;
    res = JS_DeleteProperty(ctx, obj, prop, flags);
    JS_FreeAtom(ctx, prop);
    return res;
}